

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lru_cache.hpp
# Opt level: O3

void __thiscall
cappuccino::
lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_(cappuccino::thread_safe)1>
::lru_cache(lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_(cappuccino::thread_safe)1>
            *this,size_t capacity,float max_load_factor)

{
  lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_(cappuccino::thread_safe)1>
  *this_00;
  lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_(cappuccino::thread_safe)1>
  *plVar1;
  double dVar2;
  size_t sVar3;
  lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_(cappuccino::thread_safe)1>
  *plVar4;
  __hashtable *__this;
  undefined1 auVar5 [16];
  allocator_type local_36;
  allocator_type local_35;
  float local_34;
  
  *(undefined8 *)(this + 0x20) = 0;
  *(undefined8 *)(this + 0x28) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  local_34 = max_load_factor;
  std::
  vector<cappuccino::lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_(cappuccino::thread_safe)1>::element,_std::allocator<cappuccino::lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_(cappuccino::thread_safe)1>::element>_>
  ::vector((vector<cappuccino::lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_(cappuccino::thread_safe)1>::element,_std::allocator<cappuccino::lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_(cappuccino::thread_safe)1>::element>_>
            *)(this + 0x30),capacity,&local_35);
  *(lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_(cappuccino::thread_safe)1>
    **)(this + 0x48) = this + 0x78;
  *(undefined8 *)(this + 0x50) = 1;
  *(undefined8 *)(this + 0x58) = 0;
  *(undefined8 *)(this + 0x60) = 0;
  *(undefined4 *)(this + 0x68) = 0x3f800000;
  *(undefined8 *)(this + 0x70) = 0;
  *(undefined8 *)(this + 0x78) = 0;
  this_00 = this + 0x80;
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::list
            ((list<unsigned_long,_std::allocator<unsigned_long>_> *)this_00,capacity,&local_36);
  *(undefined8 *)(this + 0x98) = 0;
  plVar1 = *(lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_(cappuccino::thread_safe)1>
             **)(this + 0x80);
  if (plVar1 != this_00) {
    sVar3 = 0;
    plVar4 = plVar1;
    do {
      *(size_t *)(plVar4 + 0x10) = sVar3;
      sVar3 = sVar3 + 1;
      plVar4 = *(lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_(cappuccino::thread_safe)1>
                 **)plVar4;
    } while (plVar4 != this_00);
  }
  *(lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_(cappuccino::thread_safe)1>
    **)(this + 0x98) = plVar1;
  *(float *)(this + 0x68) = local_34;
  auVar5._8_4_ = (int)(capacity >> 0x20);
  auVar5._0_8_ = capacity;
  auVar5._12_4_ = 0x45300000;
  *(undefined8 *)(this + 0x70) = 0;
  dVar2 = ceil(((auVar5._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)capacity) - 4503599627370496.0)) / (double)local_34
              );
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::rehash((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            *)(this + 0x48),
           (long)(dVar2 - 9.223372036854776e+18) & (long)dVar2 >> 0x3f | (long)dVar2);
  return;
}

Assistant:

explicit lru_cache(size_t capacity, float max_load_factor = 1.0f) : m_elements(capacity), m_lru_list(capacity)
    {
        std::iota(m_lru_list.begin(), m_lru_list.end(), 0);
        m_lru_end = m_lru_list.begin();

        m_keyed_elements.max_load_factor(max_load_factor);
        m_keyed_elements.reserve(capacity);
    }